

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

void __thiscall Clasp::Solver::Solver(Solver *this,SharedContext *ctx,uint32 id)

{
  SolverStrategies *this_00;
  uint *puVar1;
  Var VVar2;
  
  (this->rng).seed_ = 1;
  (this->lower).level = 0;
  (this->model).ebo_.buf = (pointer)0x0;
  (this->model).ebo_.size = 0;
  (this->model).ebo_.cap = 0;
  (this->lower).bound = -0x8000000000000000;
  SolverStats::SolverStats(&this->stats);
  this->shared_ = ctx;
  this_00 = &this->strategy_;
  SolverStrategies::SolverStrategies(this_00);
  (this->heuristic_).ptr_ = (uintp)&null_heuristic_g;
  this->ccMin_ = (CCMinRecursive *)0x0;
  this->postHead_ = (PostPropagator **)&sent_list;
  this->undoHead_ = (ConstraintDB *)0x0;
  this->enum_ = (Constraint *)0x0;
  this->memUse_ = 0;
  this->lazyRem_ = (Dirty *)0x0;
  this->dynLimit_ = (DynamicLimit *)0x0;
  SmallClauseAlloc::SmallClauseAlloc(&this->smallAlloc_);
  (this->assign_).trail.ebo_.buf = (pointer)0x0;
  (this->assign_).trail.ebo_.size = 0;
  (this->assign_).trail.ebo_.cap = 0;
  (this->assign_).front = 0;
  (this->assign_).assign_.ebo_.buf = (pointer)0x0;
  (this->assign_).assign_.ebo_.size = 0;
  (this->assign_).assign_.ebo_.cap = 0;
  (this->assign_).reason_.super_type.ebo_.buf = (pointer)0x0;
  (this->assign_).reason_.super_type.ebo_.size = 0;
  (this->assign_).reason_.super_type.ebo_.cap = 0;
  (this->assign_).reason_.data_.ebo_.buf = (pointer)0x0;
  (this->assign_).reason_.data_.ebo_.size = 0;
  (this->assign_).reason_.data_.ebo_.cap = 0;
  (this->assign_).pref_.ebo_.buf = (pointer)0x0;
  (this->assign_).pref_.ebo_.size = 0;
  (this->assign_).pref_.ebo_.cap = 0;
  (this->levels_).jump = 0;
  (this->assign_).elims_ = 0;
  (this->assign_).units_ = 0;
  (this->levels_).super_type.ebo_.buf = (pointer)0x0;
  (this->levels_).super_type.ebo_.size = 0;
  (this->levels_).super_type.ebo_.cap = 0;
  *(undefined8 *)&(this->levels_).root = 0;
  (this->constraints_).ebo_.buf = (pointer)0x0;
  (this->constraints_).ebo_.size = 0;
  (this->constraints_).ebo_.cap = 0;
  (this->learnts_).ebo_.buf = (pointer)0x0;
  (this->learnts_).ebo_.size = 0;
  (this->learnts_).ebo_.cap = 0;
  PropagatorList::PropagatorList(&this->post_);
  memset(&this->watches_,0,0x88);
  (this->ccInfo_).super_ConstraintScore.rep = 0x10000000;
  this->tag_ = 0;
  this->dbIdx_ = 0;
  *(undefined8 *)((long)&this->dbIdx_ + 1) = 0;
  VVar2 = Assignment::addVar(&this->assign_);
  puVar1 = (this->assign_).assign_.ebo_.buf + VVar2;
  *puVar1 = *puVar1 | 0xd;
  *this_00 = (SolverStrategies)((ulong)*this_00 & 0x3ffffffffffffff | (ulong)id << 0x3a);
  return;
}

Assistant:

Solver::Solver(SharedContext* ctx, uint32 id)
	: shared_(ctx)
	, heuristic_(&null_heuristic_g, Ownership_t::Retain)
	, ccMin_(0)
	, postHead_(&sent_list)
	, undoHead_(0)
	, enum_(0)
	, memUse_(0)
	, lazyRem_(0)
	, dynLimit_(0)
	, ccInfo_(Constraint_t::Conflict)
	, dbIdx_(0)
	, lastSimp_(0)
	, shufSimp_(0)
	, initPost_(0)
	, splitReq_(false) {
	Var trueVar = assign_.addVar();
	assign_.setValue(trueVar, value_true);
	markSeen(trueVar);
	strategy_.id = id;
}